

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneParser.cpp
# Opt level: O1

void __thiscall SceneParser::parseMaterials(SceneParser *this)

{
  pointer *pppMVar1;
  iterator __position;
  int iVar2;
  char token [100];
  Material *local_a0;
  short local_98;
  undefined4 uStack_96;
  undefined2 uStack_92;
  char local_90;
  undefined4 uStack_8f;
  undefined1 uStack_8b;
  
  getToken(this,(char *)&local_98);
  if (local_98 != 0x7b) {
    __assert_fail("!strcmp(token, \"{\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0xb0,"void SceneParser::parseMaterials()");
  }
  getToken(this,(char *)&local_98);
  if (CONCAT44(uStack_8f,CONCAT13(local_90,CONCAT21(uStack_92,uStack_96._3_1_))) == 0x736c6169726574
      && CONCAT26(uStack_92,CONCAT42(uStack_96,local_98)) == 0x726574614d6d756e) {
    iVar2 = readInt(this);
    this->_num_materials = iVar2;
    if (0 < iVar2) {
      iVar2 = 0;
      do {
        getToken(this,(char *)&local_98);
        if ((local_90 != '\0' ||
             CONCAT26(uStack_92,CONCAT42(uStack_96,local_98)) != 0x6c6169726574614d) &&
           (CONCAT17(uStack_8b,CONCAT43(uStack_8f,CONCAT12(local_90,uStack_92))) != 0x6c616972657461
            || CONCAT26(uStack_92,CONCAT42(uStack_96,local_98)) != 0x74614d676e6f6850)) {
          printf("Unknown token in parseMaterial: \'%s\'\n",&local_98);
          exit(0);
        }
        local_a0 = parseMaterial(this);
        __position._M_current =
             (this->_materials).super__Vector_base<Material_*,_std::allocator<Material_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->_materials).super__Vector_base<Material_*,_std::allocator<Material_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Material*,std::allocator<Material*>>::_M_realloc_insert<Material*>
                    ((vector<Material*,std::allocator<Material*>> *)&this->_materials,__position,
                     &local_a0);
        }
        else {
          *__position._M_current = local_a0;
          pppMVar1 = &(this->_materials).super__Vector_base<Material_*,_std::allocator<Material_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppMVar1 = *pppMVar1 + 1;
        }
        iVar2 = iVar2 + 1;
      } while (iVar2 < this->_num_materials);
    }
    getToken(this,(char *)&local_98);
    if (local_98 == 0x7d) {
      return;
    }
    __assert_fail("!strcmp(token, \"}\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0xc5,"void SceneParser::parseMaterials()");
  }
  __assert_fail("!strcmp(token, \"numMaterials\")",
                "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                ,0xb4,"void SceneParser::parseMaterials()");
}

Assistant:

void
SceneParser::parseMaterials() {
    // Ensure the structure is valid.
    char token[MAX_PARSER_TOKEN_LENGTH];
    getToken(token);
    assert(!strcmp(token, "{"));

    // Read in the number of objects.
    getToken(token);
    assert(!strcmp(token, "numMaterials"));
    _num_materials = readInt();

    // Read in the objects.
    int count = 0;
    while (_num_materials > count) {
        getToken(token);
        if (!strcmp(token, "Material") ||
            !strcmp(token, "PhongMaterial")) {
            _materials.push_back(parseMaterial());
        } else {
            printf("Unknown token in parseMaterial: '%s'\n", token);
            exit(0);
        }
        count++;
    }
    getToken(token);
    assert(!strcmp(token, "}"));
}